

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

EnumSchema __thiscall capnp::Schema::asEnum(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  ArrayPtr<const_char> local_50;
  Reader local_40;
  
  getProto(&local_40,this);
  if (local_40._reader.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_40._reader.data + 0xc) == 2;
    if (_kjCondition.value) {
      return (EnumSchema)(Schema)this->raw;
    }
  }
  getProto(&local_40,this);
  local_50 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_40);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x123,FAILED,"getProto().isEnum()",
             "_kjCondition,\"Tried to use non-enum schema as an enum.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [41])"Tried to use non-enum schema as an enum.",
             (Reader *)&local_50);
  kj::_::Debug::Fault::~Fault(&f);
  return (EnumSchema)((long)capnp::_::NULL_ENUM_SCHEMA + 0x48);
}

Assistant:

EnumSchema Schema::asEnum() const {
  KJ_REQUIRE(getProto().isEnum(), "Tried to use non-enum schema as an enum.",
             getProto().getDisplayName()) {
    return EnumSchema();
  }
  return EnumSchema(*this);
}